

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O2

void work_mgga_exc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                      xc_mgga_out_params *out)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double __x;
  double dVar47;
  undefined1 auVar48 [16];
  undefined8 uVar49;
  double dVar50;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double local_280;
  double local_258;
  double local_248;
  double local_210;
  double local_1e8;
  double local_118;
  double local_f8;
  double local_e8;
  
  local_118 = 0.0;
  local_1e8 = 0.0;
  dVar46 = 0.0;
  local_f8 = 0.0;
  for (sVar7 = 0; np != sVar7; sVar7 = sVar7 + 1) {
    lVar6 = (long)(p->dim).rho * sVar7;
    dVar26 = rho[lVar6];
    if (p->nspin == 2) {
      dVar26 = dVar26 + rho[lVar6 + 1];
    }
    dVar1 = p->dens_threshold;
    if (dVar1 <= dVar26) {
      dVar26 = rho[lVar6];
      if (rho[lVar6] <= dVar1) {
        dVar26 = dVar1;
      }
      dVar27 = p->sigma_threshold * p->sigma_threshold;
      lVar8 = (long)(p->dim).sigma * sVar7;
      local_210 = sigma[lVar8];
      if (sigma[lVar8] <= dVar27) {
        local_210 = dVar27;
      }
      uVar2 = p->info->flags;
      if ((uVar2 >> 0x10 & 1) != 0) {
        dVar46 = tau[(long)(p->dim).tau * sVar7];
        if (tau[(long)(p->dim).tau * sVar7] <= p->tau_threshold) {
          dVar46 = p->tau_threshold;
        }
        if (((uVar2 >> 0x11 & 1) != 0) && (dVar43 = dVar26 * 8.0 * dVar46, dVar43 <= local_210)) {
          local_210 = dVar43;
        }
      }
      if (p->nspin == 2) {
        local_118 = rho[lVar6 + 1];
        if (rho[lVar6 + 1] <= dVar1) {
          local_118 = dVar1;
        }
        local_1e8 = sigma[lVar8 + 2];
        if (sigma[lVar8 + 2] <= dVar27) {
          local_1e8 = dVar27;
        }
        if ((uVar2 >> 0x10 & 1) != 0) {
          local_f8 = tau[(long)(p->dim).tau * sVar7 + 1];
          if (tau[(long)(p->dim).tau * sVar7 + 1] <= p->tau_threshold) {
            local_f8 = p->tau_threshold;
          }
          if (((uVar2 >> 0x11 & 1) != 0) &&
             (dVar27 = local_118 * 8.0 * local_f8, dVar27 <= local_1e8)) {
            local_1e8 = dVar27;
          }
        }
      }
      pdVar3 = (double *)p->params;
      dVar44 = dVar26 - local_118;
      __x = dVar26 + local_118;
      dVar28 = (1.0 / __x) * dVar44;
      dVar29 = dVar28 + 1.0;
      dVar27 = p->zeta_threshold;
      dVar43 = cbrt(0.3183098861837907);
      dVar11 = dVar43 * 2.519842099789747 * 1.2599210498948732;
      dVar12 = cbrt(dVar27);
      dVar30 = dVar27 * dVar12;
      local_280 = dVar30;
      if (dVar27 < 2.0) {
        local_280 = 2.5198420997897464;
      }
      dVar13 = cbrt(__x);
      dVar14 = cbrt(1.0 / dVar29);
      dVar15 = cbrt(9.0);
      dVar45 = (1.0 / dVar13) * 1.2599210498948732;
      dVar12 = 1.0 / dVar12;
      dVar22 = (double)(~-(ulong)(2.0 <= dVar27) & 0x3fe965fea53d6e3c |
                       -(ulong)(2.0 <= dVar27) & (ulong)dVar12);
      dVar47 = p->cam_omega * 1.4422495703074083 * dVar15 * dVar15 * dVar43 * dVar43 * dVar45;
      dVar31 = (dVar14 * dVar22 * dVar47) / 18.0;
      dVar15 = 1.35;
      if (dVar31 <= 1.35) {
        dVar15 = dVar31;
      }
      dVar16 = erf((1.0 / dVar15) * 0.5);
      dVar17 = exp((-1.0 / (dVar15 * dVar15)) * 0.25);
      if (1.35 <= dVar31) {
        if (dVar31 <= 1.35) {
          dVar31 = 1.35;
        }
        auVar55._0_8_ = dVar31 * dVar31;
        dVar15 = auVar55._0_8_ * auVar55._0_8_;
        auVar55._8_8_ = dVar15;
        dVar31 = dVar15 * dVar15;
        auVar56 = divpd(_DAT_00f4add0,auVar55);
        auVar52 = divpd(auVar56,_DAT_00f570a0);
        auVar48._8_8_ = dVar31;
        auVar48._0_8_ = auVar55._0_8_ * dVar15;
        auVar48 = divpd(_DAT_00f4add0,auVar48);
        uVar49 = auVar48._8_8_;
        auVar42._8_8_ = 0x3ff0000000000000;
        auVar42._0_8_ = uVar49;
        auVar56._8_8_ = dVar31 * dVar31;
        auVar56._0_8_ = auVar55._0_8_ * dVar15;
        auVar56 = divpd(auVar42,auVar56);
        auVar57._8_8_ = uVar49;
        auVar57._0_8_ = uVar49;
        auVar42 = divpd(auVar57,auVar55);
        auVar48 = divpd(auVar48,_DAT_00f570b0);
        auVar42 = divpd(auVar42,_DAT_00f570c0);
        auVar56 = divpd(auVar56,_DAT_00f570d0);
        local_258 = ((((((auVar52._0_8_ - auVar52._8_8_) + auVar48._0_8_) - auVar48._8_8_) +
                      auVar42._0_8_) - auVar42._8_8_) + auVar56._0_8_) - auVar56._8_8_;
      }
      else {
        local_258 = dVar15 * -2.6666666666666665 *
                    (dVar16 * 1.7724538509055159 +
                    (dVar17 + -1.5 + (dVar17 + -1.0) * dVar15 * dVar15 * -2.0) * (dVar15 + dVar15))
                    + 1.0;
      }
      dVar15 = *pdVar3;
      dVar31 = pdVar3[1];
      dVar32 = dVar26 * dVar26;
      dVar16 = cbrt(dVar26);
      dVar33 = 1.0 / (dVar16 * dVar16);
      dVar17 = dVar33 / dVar32;
      dVar34 = local_210 * dVar17;
      dVar16 = pdVar3[2];
      dVar18 = cbrt(9.869604401089358);
      dVar18 = dVar18 * dVar18 * 3.3019272488946267 * 0.3;
      dVar35 = (dVar33 / dVar26) * dVar46;
      dVar59 = dVar18 - dVar35;
      dVar36 = dVar35 + dVar18;
      dVar33 = 0.0;
      if (dVar1 < dVar26 && dVar27 < dVar29) {
        dVar33 = dVar29 * 1.4422495703074083 * dVar11 * -0.046875 *
                 (dVar16 * dVar59 * (1.0 / dVar36) +
                 local_210 * dVar31 * 0.003840616724010807 * dVar17 *
                 (1.0 / (dVar34 * 0.003840616724010807 + 1.0)) + dVar15) *
                 (1.0 / dVar14) * local_258 * dVar13 * local_280;
      }
      dVar28 = 1.0 - dVar28;
      dVar14 = p->zeta_threshold;
      dVar60 = p->dens_threshold;
      dVar19 = cbrt(1.0 / dVar28);
      dVar47 = (dVar47 * dVar22 * dVar19) / 18.0;
      dVar22 = 1.35;
      if (dVar47 <= 1.35) {
        dVar22 = dVar47;
      }
      dVar20 = erf((1.0 / dVar22) * 0.5);
      dVar21 = exp((-1.0 / (dVar22 * dVar22)) * 0.25);
      if (1.35 <= dVar47) {
        if (dVar47 <= 1.35) {
          dVar47 = 1.35;
        }
        auVar53._0_8_ = dVar47 * dVar47;
        dVar22 = auVar53._0_8_ * auVar53._0_8_;
        auVar53._8_8_ = dVar22;
        dVar47 = dVar22 * dVar22;
        auVar56 = divpd(_DAT_00f4add0,auVar53);
        auVar57 = divpd(auVar56,_DAT_00f570a0);
        auVar40._8_8_ = dVar47;
        auVar40._0_8_ = auVar53._0_8_ * dVar22;
        auVar48 = divpd(_DAT_00f4add0,auVar40);
        uVar49 = auVar48._8_8_;
        auVar25._8_8_ = 0x3ff0000000000000;
        auVar25._0_8_ = uVar49;
        auVar52._8_8_ = dVar47 * dVar47;
        auVar52._0_8_ = auVar53._0_8_ * dVar22;
        auVar56 = divpd(auVar25,auVar52);
        auVar41._8_8_ = uVar49;
        auVar41._0_8_ = uVar49;
        auVar42 = divpd(auVar41,auVar53);
        auVar48 = divpd(auVar48,_DAT_00f570b0);
        auVar42 = divpd(auVar42,_DAT_00f570c0);
        auVar56 = divpd(auVar56,_DAT_00f570d0);
        local_248 = ((((((auVar57._0_8_ - auVar57._8_8_) + auVar48._0_8_) - auVar48._8_8_) +
                      auVar42._0_8_) - auVar42._8_8_) + auVar56._0_8_) - auVar56._8_8_;
      }
      else {
        local_248 = dVar22 * -2.6666666666666665 *
                    (dVar20 * 1.7724538509055159 +
                    (dVar21 + -1.5 + (dVar21 + -1.0) * dVar22 * dVar22 * -2.0) * (dVar22 + dVar22))
                    + 1.0;
      }
      bVar5 = dVar60 < local_118;
      dVar20 = local_118 * local_118;
      dVar22 = cbrt(local_118);
      dVar47 = 1.0 / (dVar22 * dVar22);
      dVar54 = dVar47 / dVar20;
      dVar22 = local_1e8 * dVar54;
      dVar21 = (dVar47 / local_118) * local_f8;
      dVar58 = dVar18 - dVar21;
      dVar47 = dVar18 + dVar21;
      dVar60 = 0.0;
      if (dVar14 < dVar28 && bVar5) {
        dVar60 = dVar28 * 1.4422495703074083 * dVar11 * -0.046875 *
                 dVar13 * local_280 *
                 (dVar16 * dVar58 * (1.0 / dVar47) +
                 dVar31 * local_1e8 * 0.003840616724010807 * dVar54 *
                 (1.0 / (dVar22 * 0.003840616724010807 + 1.0)) + dVar15) *
                 (1.0 / dVar19) * local_248;
      }
      dVar11 = dVar29;
      if (dVar29 <= dVar27) {
        dVar11 = p->zeta_threshold;
      }
      dVar31 = dVar43 * 1.4422495703074083 * 2.519842099789747;
      dVar16 = cbrt(dVar29);
      uVar9 = -(ulong)(dVar29 <= dVar27);
      dVar23 = (double)(uVar9 & (ulong)dVar12 | ~uVar9 & (ulong)(1.0 / dVar16));
      dVar45 = dVar45 * dVar31;
      dVar37 = dVar45 * dVar23;
      dVar19 = SQRT(dVar37);
      dVar15 = dVar19;
      if (dVar37 < 0.0) {
        dVar15 = sqrt(dVar37);
      }
      if (dVar37 < 0.0) {
        dVar19 = sqrt(dVar37);
      }
      dVar19 = dVar19 * dVar37;
      dVar38 = dVar43 * dVar43 * 2.080083823051904 * 1.5874010519681996;
      dVar50 = 1.0 / (dVar13 * dVar13);
      dVar51 = dVar50 * 1.5874010519681996 * dVar38;
      dVar43 = dVar23 * dVar23 * dVar51;
      dVar23 = log(16.081979498692537 /
                   (dVar43 * 0.123235 + dVar19 * 0.204775 + dVar15 * 3.79785 + dVar37 * 0.8969) +
                   1.0);
      dVar23 = (dVar37 * 0.053425 + 1.0) * 0.0621814 * dVar23;
      local_e8 = 0.0;
      dVar39 = (local_280 + (double)(-(ulong)(0.0 <= p->zeta_threshold) & (ulong)dVar30) + -2.0) *
               1.9236610509315362;
      dVar24 = log(32.16395899738507 /
                   (dVar43 * 0.1562925 + dVar19 * 0.420775 + dVar15 * 7.05945 + dVar37 * 1.549425) +
                   1.0);
      dVar43 = log(29.608749977793437 /
                   (dVar43 * 0.1241775 + dVar19 * 0.1100325 + dVar15 * 5.1785 + dVar37 * 0.905775) +
                   1.0);
      dVar43 = dVar43 * (dVar37 * 0.0278125 + 1.0);
      if (dVar1 < dVar26 && dVar27 < dVar29) {
        local_e8 = dVar11 * (dVar43 * dVar39 * 0.0197516734986138 +
                            ((dVar43 * -0.0197516734986138 +
                             (dVar37 * 0.05137 + 1.0) * -0.0310907 * dVar24 + dVar23) * dVar39 -
                            dVar23)) * 0.5;
      }
      dVar26 = pdVar3[3];
      dVar1 = pdVar3[4];
      dVar27 = pdVar3[5];
      dVar43 = pdVar3[6];
      dVar11 = pdVar3[7];
      dVar15 = dVar28;
      if (dVar28 <= dVar14) {
        dVar15 = p->zeta_threshold;
      }
      dVar19 = cbrt(dVar28);
      uVar10 = -(ulong)(dVar28 <= dVar14);
      dVar23 = (double)((ulong)dVar12 & uVar10 | ~uVar10 & (ulong)(1.0 / dVar19));
      dVar45 = dVar45 * dVar23;
      dVar37 = SQRT(dVar45);
      dVar12 = dVar37;
      if (dVar45 < 0.0) {
        dVar12 = sqrt(dVar45);
      }
      if (dVar45 < 0.0) {
        dVar37 = sqrt(dVar45);
      }
      dVar37 = dVar37 * dVar45;
      dVar51 = dVar51 * dVar23 * dVar23;
      dVar23 = log(16.081979498692537 /
                   (dVar51 * 0.123235 + dVar37 * 0.204775 + dVar12 * 3.79785 + dVar45 * 0.8969) +
                   1.0);
      dVar23 = (dVar45 * 0.053425 + 1.0) * 0.0621814 * dVar23;
      dVar24 = log(32.16395899738507 /
                   (dVar51 * 0.1562925 + dVar37 * 0.420775 + dVar12 * 7.05945 + dVar45 * 1.549425) +
                   1.0);
      dVar37 = log(29.608749977793437 /
                   (dVar51 * 0.1241775 + dVar37 * 0.1100325 + dVar12 * 5.1785 + dVar45 * 0.905775) +
                   1.0);
      dVar37 = dVar37 * (dVar45 * 0.0278125 + 1.0);
      dVar12 = 0.0;
      if (dVar14 < dVar28 && bVar5) {
        dVar12 = dVar15 * ((dVar39 * (dVar37 * -0.0197516734986138 +
                                     (dVar45 * 0.05137 + 1.0) * -0.0310907 * dVar24 + dVar23) -
                           dVar23) + dVar39 * 0.0197516734986138 * dVar37) * 0.5;
      }
      dVar31 = dVar31 * (1.0 / dVar13);
      dVar13 = SQRT(dVar31);
      dVar15 = dVar13;
      if (dVar31 < 0.0) {
        dVar15 = sqrt(dVar31);
      }
      if (dVar31 < 0.0) {
        dVar13 = sqrt(dVar31);
      }
      dVar13 = dVar13 * dVar31;
      dVar38 = dVar38 * dVar50;
      dVar14 = log(16.081979498692537 /
                   (dVar38 * 0.123235 + dVar13 * 0.204775 + dVar15 * 3.79785 + dVar31 * 0.8969) +
                   1.0);
      dVar19 = ((double)(uVar10 & (ulong)dVar30 | ~uVar10 & (ulong)(dVar28 * dVar19)) +
                (double)(uVar9 & (ulong)dVar30 | ~uVar9 & (ulong)(dVar29 * dVar16)) + -2.0) *
               1.9236610509315362;
      dVar45 = log(32.16395899738507 /
                   (dVar38 * 0.1562925 + dVar13 * 0.420775 + dVar15 * 7.05945 + dVar31 * 1.549425) +
                   1.0);
      dVar15 = log(29.608749977793437 /
                   (dVar38 * 0.1241775 + dVar13 * 0.1100325 + dVar15 * 5.1785 + dVar31 * 0.905775) +
                   1.0);
      dVar15 = dVar15 * (dVar31 * 0.0278125 + 1.0);
      dVar18 = dVar18 * (dVar35 + dVar21);
      dVar21 = (dVar35 + dVar35) * dVar21;
      dVar35 = dVar18 - dVar21;
      dVar35 = dVar35 * dVar35;
      dVar29 = pdVar3[9];
      dVar21 = dVar21 + dVar18;
      dVar21 = dVar21 * dVar21;
      dVar16 = dVar35 * dVar35 * dVar35;
      dVar30 = pdVar3[10];
      dVar18 = (1.0 / (dVar21 * dVar21)) / dVar21;
      dVar28 = pdVar3[0xb];
      dVar13 = dVar34 + dVar22;
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      dVar13 = cbrt(dVar13 * 1.4142135623730951);
      pdVar4 = out->zk;
      if ((pdVar4 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        dVar37 = dVar36 * dVar36;
        dVar51 = dVar59 * dVar59;
        dVar38 = dVar58 * dVar58;
        dVar24 = dVar47 * dVar47;
        dVar23 = local_210 * local_210;
        dVar23 = dVar23 * dVar23 * dVar23;
        dVar61 = dVar34 * 0.46914023462026644 + 1.0;
        dVar34 = dVar61 * dVar61;
        dVar39 = local_1e8 * local_1e8;
        dVar39 = dVar39 * dVar39 * dVar39;
        dVar62 = dVar22 * 0.46914023462026644 + 1.0;
        dVar50 = dVar62 * dVar62;
        dVar22 = dVar32 * dVar32 * dVar32 * dVar32;
        dVar32 = 1.0 / (dVar22 * dVar22);
        dVar34 = (1.0 / (dVar34 * dVar34)) / dVar34;
        dVar22 = dVar20 * dVar20 * dVar20 * dVar20;
        dVar22 = 1.0 / (dVar22 * dVar22);
        dVar50 = (1.0 / (dVar50 * dVar50)) / dVar50;
        dVar14 = (dVar31 * 0.053425 + 1.0) * 0.0621814 * dVar14;
        lVar6 = (long)(p->dim).zk * sVar7;
        pdVar4[lVar6] =
             dVar33 + dVar60 +
             ((1.0 / (dVar37 * dVar37)) * dVar51 * dVar51 * dVar11 * 0.010661445329398458 * dVar23 *
              dVar32 * dVar34 +
             dVar23 * dVar43 * 0.010661445329398458 * dVar32 * dVar34 +
             (1.0 / dVar36) * dVar59 * dVar1 +
             dVar17 * local_210 * dVar26 * 0.46914023462026644 * (1.0 / dVar61) +
             (1.0 / dVar37) * dVar51 * dVar27) * local_e8 +
             ((1.0 / (dVar24 * dVar24)) * dVar38 * dVar38 * dVar11 * 0.010661445329398458 * dVar39 *
              dVar22 * dVar50 +
             dVar43 * dVar39 * 0.010661445329398458 * dVar22 * dVar50 +
             (1.0 / dVar47) * dVar58 * dVar1 +
             dVar54 * dVar26 * local_1e8 * 0.46914023462026644 * (1.0 / dVar62) +
             (1.0 / dVar24) * dVar38 * dVar27) * dVar12 +
             ((1.0 / dVar21) * 1.2599210498948732 * dVar13 * dVar13 * dVar35 * pdVar3[0xc] * 0.5 +
             dVar16 * dVar28 * dVar18 * 1.2599210498948732 * dVar13 * dVar13 * 0.5 +
             dVar30 * dVar16 * dVar18 + dVar29 * dVar35 * (1.0 / dVar21) + pdVar3[8]) *
             (((dVar19 * 0.0197516734986138 * dVar15 +
               (dVar19 * (dVar15 * -0.0197516734986138 +
                         (dVar31 * 0.05137 + 1.0) * -0.0310907 * dVar45 + dVar14) *
                (1.0 / (__x * __x * __x * __x)) * dVar44 * dVar44 * dVar44 * dVar44 - dVar14)) -
              local_e8) - dVar12) + pdVar4[lVar6];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}